

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O2

ssize_t zt_cstr_itoa(char *s,int value,size_t offset,size_t bufsiz)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  
  uVar1 = (ulong)(uint)value;
  sVar3 = zt_cstr_int_display_len(value);
  uVar4 = sVar3 + offset;
  if (bufsiz < uVar4 || s == (char *)0x0) {
    uVar4 = 0xffffffffffffffff;
  }
  else {
    if (value < 0) {
      s[offset] = '-';
    }
    pcVar5 = s + uVar4;
    *pcVar5 = '\0';
    do {
      pcVar5 = pcVar5 + -1;
      iVar2 = (int)uVar1;
      uVar1 = (long)iVar2 / 10;
      *pcVar5 = "9876543210123456789"[(long)(iVar2 % 10) + 9];
    } while (0x12 < iVar2 + 9U);
  }
  return uVar4;
}

Assistant:

ssize_t zt_cstr_itoa(char *s, int value, size_t offset, size_t bufsiz)
{
    size_t    loc;
    ssize_t   result;

    result = loc = offset + zt_cstr_int_display_len(value);

    if ((s == NULL) || (loc > bufsiz)) {
        return -1;
    }

    if (value < 0) {
        s[offset] = '-';
    }

    s[loc] = 0;
    loc--;

    do {
        s[loc] = *(_itoa_integers + 9 + (value % 10));
        value /= 10;
        loc--;
    } while(value != 0);

    return result;
}